

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall hdc::Parser::hasParameters(Parser *this)

{
  TokenKind TVar1;
  reference pTVar2;
  __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_> local_20;
  iterator it;
  Parser *this_local;
  
  local_20._M_current = (this->current_token)._M_current;
  it._M_current = (Token *)this;
  pTVar2 = __gnu_cxx::
           __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>::
           operator*(&local_20);
  TVar1 = Token::getKind(pTVar2);
  if (TVar1 == TK_AT) {
    __gnu_cxx::
    __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>::
    operator++(&local_20);
    pTVar2 = __gnu_cxx::
             __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
             ::operator*(&local_20);
    TVar1 = Token::getKind(pTVar2);
    if (TVar1 == TK_ID) {
      __gnu_cxx::
      __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>::
      operator++(&local_20);
      pTVar2 = __gnu_cxx::
               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
               ::operator*(&local_20);
      TVar1 = Token::getKind(pTVar2);
      if (TVar1 == TK_COLON) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Parser::hasParameters() {
    std::vector<Token>::iterator it = current_token;

    if ((*it).getKind() == TK_AT) {
        ++it;

        if ((*it).getKind() == TK_ID) {
            ++it;

            if ((*it).getKind() == TK_COLON) {
                return true;
            }
        }
    }

    return false;
}